

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildmidi_lib.cpp
# Opt level: O0

void load_patch(_mdi *mdi,unsigned_short patchid)

{
  int iVar1;
  _patch *sample_patch;
  _patch **pp_Var2;
  _patch *tmp_patch;
  uint i;
  unsigned_short patchid_local;
  _mdi *mdi_local;
  
  tmp_patch._0_4_ = 0;
  while( true ) {
    if (mdi->patch_count <= (ulong)(uint)tmp_patch) {
      sample_patch = get_patch_data(patchid);
      if (sample_patch != (_patch *)0x0) {
        FCriticalSection::Enter(&patch_lock);
        if ((sample_patch->loaded == '\0') && (iVar1 = load_sample(sample_patch), iVar1 == -1)) {
          FCriticalSection::Leave(&patch_lock);
        }
        else if (sample_patch->first_sample == (_sample *)0x0) {
          FCriticalSection::Leave(&patch_lock);
        }
        else {
          mdi->patch_count = mdi->patch_count + 1;
          pp_Var2 = (_patch **)realloc(mdi->patches,mdi->patch_count << 3);
          mdi->patches = pp_Var2;
          mdi->patches[mdi->patch_count - 1] = sample_patch;
          sample_patch->inuse_count = sample_patch->inuse_count + 1;
          FCriticalSection::Leave(&patch_lock);
        }
      }
      return;
    }
    if (mdi->patches[(uint)tmp_patch]->patchid == patchid) break;
    tmp_patch._0_4_ = (uint)tmp_patch + 1;
  }
  return;
}

Assistant:

static void load_patch(struct _mdi *mdi, unsigned short patchid) {
	unsigned int i;
	struct _patch *tmp_patch = NULL;

	for (i = 0; i < mdi->patch_count; i++) {
		if (mdi->patches[i]->patchid == patchid) {
			return;
		}
	}

	tmp_patch = get_patch_data(patchid);
	if (tmp_patch == NULL) {
		return;
	}

	patch_lock.Enter();
	if (!tmp_patch->loaded) {
		if (load_sample(tmp_patch) == -1) {
			patch_lock.Leave();
			return;
		}
	}

	if (tmp_patch->first_sample == NULL) {
		patch_lock.Leave();
		return;
	}

	mdi->patch_count++;
	mdi->patches = (struct _patch**)realloc(mdi->patches,
			(sizeof(struct _patch*) * mdi->patch_count));
	mdi->patches[mdi->patch_count - 1] = tmp_patch;
	tmp_patch->inuse_count++;
	patch_lock.Leave();
}